

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

QPDFFormFieldObjectHelper * __thiscall
QPDFAcroFormDocumentHelper::getFieldForAnnotation
          (QPDFFormFieldObjectHelper *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,
          QPDFAnnotationObjectHelper *h)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  QPDFObjectHandle oh;
  QPDFObjGen og;
  allocator<char> local_7a;
  allocator<char> local_79;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  QPDFObjectHandle local_68;
  string local_58;
  string local_38;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(h->super_QPDFObjectHelper).super_BaseHandle);
  QPDFObjectHandle::newNull();
  QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(__return_storage_ptr__,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/Widget",&local_7a);
  bVar1 = QPDFObjectHandle::isDictionaryOfType((QPDFObjectHandle *)&local_78,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    analyze(this);
    local_58._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_78);
    sVar2 = std::
            map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
            ::count(&((this->m).
                      super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->annotation_to_field,(key_type *)&local_58);
    if (sVar2 != 0) {
      pmVar3 = std::
               map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
               ::operator[](&((this->m).
                              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->annotation_to_field,(key_type *)&local_58);
      QPDFFormFieldObjectHelper::operator=(__return_storage_ptr__,pmVar3);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

QPDFFormFieldObjectHelper
QPDFAcroFormDocumentHelper::getFieldForAnnotation(QPDFAnnotationObjectHelper h)
{
    QPDFObjectHandle oh = h.getObjectHandle();
    QPDFFormFieldObjectHelper result(QPDFObjectHandle::newNull());
    if (!oh.isDictionaryOfType("", "/Widget")) {
        return result;
    }
    analyze();
    QPDFObjGen og(oh.getObjGen());
    if (m->annotation_to_field.count(og)) {
        result = m->annotation_to_field[og];
    }
    return result;
}